

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall Config::SetInt(Config *this,string *key,int val)

{
  mapped_type *this_00;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [380];
  int local_1c;
  string *psStack_18;
  int val_local;
  string *key_local;
  Config *this_local;
  
  local_1c = val;
  psStack_18 = key;
  key_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::operator<<(local_198,local_1c);
  std::__cxx11::stringstream::str();
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->config_,key);
  std::__cxx11::string::operator=((string *)this_00,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void Config::SetInt(string key, int val)
{
    stringstream ss;
    ss << val;
    config_[key] = ss.str();
}